

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IXCancellationRequest.cpp
# Opt level: O2

CancellationRequest *
ix::makeCancellationRequestWithTimeout
          (CancellationRequest *__return_storage_ptr__,int secs,
          atomic<bool> *requestInitCancellation)

{
  undefined8 uVar1;
  undefined8 *puVar2;
  
  uVar1 = ::std::chrono::_V2::system_clock::now();
  *(undefined8 *)&(__return_storage_ptr__->super__Function_base)._M_functor = 0;
  *(undefined8 *)((long)&(__return_storage_ptr__->super__Function_base)._M_functor + 8) = 0;
  (__return_storage_ptr__->super__Function_base)._M_manager = (_Manager_type)0x0;
  __return_storage_ptr__->_M_invoker = (_Invoker_type)0x0;
  puVar2 = (undefined8 *)operator_new(0x18);
  *puVar2 = requestInitCancellation;
  puVar2[1] = uVar1;
  puVar2[2] = (long)secs;
  *(undefined8 **)&(__return_storage_ptr__->super__Function_base)._M_functor = puVar2;
  __return_storage_ptr__->_M_invoker =
       ::std::
       _Function_handler<bool_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/tiwariashish86[P]IXWebSocket/ixwebsocket/IXCancellationRequest.cpp:19:40)>
       ::_M_invoke;
  (__return_storage_ptr__->super__Function_base)._M_manager =
       ::std::
       _Function_handler<bool_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/tiwariashish86[P]IXWebSocket/ixwebsocket/IXCancellationRequest.cpp:19:40)>
       ::_M_manager;
  return __return_storage_ptr__;
}

Assistant:

CancellationRequest makeCancellationRequestWithTimeout(int secs,
                                                           std::atomic<bool>& requestInitCancellation)
    {
        auto start = std::chrono::system_clock::now();
        auto timeout = std::chrono::seconds(secs);

        auto isCancellationRequested = [&requestInitCancellation, start, timeout]() -> bool
        {
            // Was an explicit cancellation requested ?
            if (requestInitCancellation) return true;

            auto now = std::chrono::system_clock::now();
            if ((now - start) > timeout) return true;

            // No cancellation request
            return false;
        };

        return isCancellationRequested;
    }